

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O1

int CBB_add_asn1(CBB *cbb,CBB *out_contents,CBS_ASN1_TAG tag)

{
  int iVar1;
  
  iVar1 = CBB_flush(cbb);
  if (iVar1 != 0) {
    if ((tag & 0x1fffffff) < 0x1f) {
      iVar1 = cbb_add_u(cbb,(ulong)(tag & 0xff | tag >> 0x18 & 0xffffffe0),1);
    }
    else {
      iVar1 = cbb_add_u(cbb,(ulong)(tag >> 0x18 | 0x1f),1);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = add_base128_integer(cbb,(ulong)(tag & 0x1fffffff));
    }
    if (iVar1 != 0) {
      iVar1 = cbb_add_child(cbb,out_contents,'\x01',1);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int CBB_add_asn1(CBB *cbb, CBB *out_contents, CBS_ASN1_TAG tag) {
  if (!CBB_flush(cbb)) {
    return 0;
  }

  // Split the tag into leading bits and tag number.
  uint8_t tag_bits = (tag >> CBS_ASN1_TAG_SHIFT) & 0xe0;
  CBS_ASN1_TAG tag_number = tag & CBS_ASN1_TAG_NUMBER_MASK;
  if (tag_number >= 0x1f) {
    // Set all the bits in the tag number to signal high tag number form.
    if (!CBB_add_u8(cbb, tag_bits | 0x1f) ||
        !add_base128_integer(cbb, tag_number)) {
      return 0;
    }
  } else if (!CBB_add_u8(cbb, tag_bits | tag_number)) {
    return 0;
  }

  // Reserve one byte of length prefix. |CBB_flush| will finish it later.
  return cbb_add_child(cbb, out_contents, /*len_len=*/1, /*is_asn1=*/1);
}